

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry *
NscBuildParameter(CNscPStackEntry *pType,CNscPStackEntry *pId,CNscPStackEntry *pInit)

{
  NscType nType;
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  size_t sVar3;
  CNscContext *pCVar4;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar5;
  size_t *pauchData;
  size_t sVar6;
  size_t local_38;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if (pType == (CNscPStackEntry *)0x0) {
    __assert_fail("pType",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x5f3,
                  "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
                 );
  }
  if (pId == (CNscPStackEntry *)0x0) {
    __assert_fail("pId",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x5f4,
                  "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
                 );
  }
  nType = pType->m_nType;
  if (((nType == NscType_Error) || (pId->m_nType == NscType_Error)) ||
     ((pInit != (CNscPStackEntry *)0x0 && (pInit->m_nType == NscType_Error)))) {
    if (this->m_nType != NscType_Unknown) goto LAB_0014a9b0;
    this->m_nType = NscType_Error;
  }
  else {
    if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript != true)) goto LAB_0014a7de;
    if ((pType->m_ulFlags & 0x80) != 0) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConstIllegalOnParameter,pId->m_pszId);
    }
    if (pInit == (CNscPStackEntry *)0x0) {
      pauchData = (size_t *)0x0;
      sVar6 = 0;
    }
    else {
      local_38 = pInit->m_nDataSize;
      pauchData = (size_t *)pInit->m_pauchData;
      NscSimplifyConstant((uchar *)pauchData,&local_38);
      sVar6 = local_38;
      pCVar4 = g_pCtx;
      sVar3 = *pauchData;
      if ((sVar3 == local_38) && ((int)pauchData[1] == 0x34)) {
        sVar6 = sVar3;
        if ((g_pCtx->m_fNWScript == true) &&
           (nType == NscType_Object && *(NscType *)((long)pauchData + 0xc) == NscType_Integer)) {
          pInit->m_nDataSize = 0;
          CNscPStackEntry::PushConstantObject(pInit,0x7f000000);
        }
        else if (*(NscType *)((long)pauchData + 0xc) != nType) {
          if (this->m_nType != NscType_Unknown) goto LAB_0014a9b0;
          this->m_nType = NscType_Error;
          CNscContext::GenerateMessage(pCVar4,NscMessage_ErrorParamDeclTypeMismatch,pId->m_pszId);
        }
      }
      else {
        if (this->m_nType != NscType_Unknown) goto LAB_0014a9b0;
        this->m_nType = NscType_Error;
        CNscContext::GenerateMessage
                  (g_pCtx,NscMessage_ErrorParamDefaultInitNotConstExp,pId->m_pszId);
      }
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = nType;
      CNscPStackEntry::PushDeclaration(this,pId->m_pszId,nType,(uchar *)pauchData,sVar6,-1,-1,0);
    }
    else if (this->m_nType != NscType_Error) {
LAB_0014a9b0:
      __assert_fail("m_nType == NscType_Unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0xee,"void CNscPStackEntry::SetType(NscType)");
    }
  }
LAB_0014a7de:
  pCVar4 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pType->m_link).m_pNext;
  if (pCVar2 != pType) {
    pCVar5 = (pType->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pType->m_link).m_pNext = &pType->m_link;
  }
  pCVar5 = &pCVar4->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pType) {
    pCVar5 = pCVar1;
  }
  pCVar1 = pCVar5->m_pNext;
  (pType->m_link).m_pNext = pCVar1;
  (pType->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pType->m_link;
  pCVar1->m_pPrev = &pType->m_link;
  pCVar4 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pId->m_link).m_pNext;
  if (pCVar2 != pId) {
    pCVar5 = (pId->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pId->m_link).m_pNext = &pId->m_link;
  }
  pCVar5 = &pCVar4->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pId) {
    pCVar5 = pCVar1;
  }
  pCVar1 = pCVar5->m_pNext;
  (pId->m_link).m_pNext = pCVar1;
  (pId->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pId->m_link;
  pCVar1->m_pPrev = &pId->m_link;
  pCVar4 = g_pCtx;
  if (pInit != (CNscPStackEntry *)0x0) {
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pInit->m_link).m_pNext;
    if (pCVar2 != pInit) {
      pCVar5 = (pInit->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pInit->m_link).m_pNext = &pInit->m_link;
    }
    pCVar5 = &pCVar4->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pInit) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pInit->m_link).m_pNext = pCVar1;
    (pInit->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pInit->m_link;
    pCVar1->m_pPrev = &pInit->m_link;
  }
  return this;
}

Assistant:

YYSTYPE NscBuildParameter (YYSTYPE pType, YYSTYPE pId, YYSTYPE pInit)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Validate what we should have
	//

	assert (pType);
	assert (pId);

	//
	// Check for silent errors
	//

	if (pType ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error ||
		(pInit != NULL && pInit ->GetType () == NscType_Error))
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are ok
	//

	else if (g_pCtx ->IsPhase2 () || g_pCtx ->IsNWScript ())
	{

		NscType nType = pType ->GetType ();

		//
		// Check for constant type
		//

		if ((pType ->GetFlags () & NscSymFlag_Constant) != 0)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorConstIllegalOnParameter,
				pId ->GetIdentifier ());
		}

		//
		// If we have an initialization, the validate
		//

		size_t nInitSize = 0;
		unsigned char *pauchInit = NULL;

		//
		// If there is an initializer
		//

		if (pInit)
		{
			
			//
			// Get the initializer
			//

			nInitSize = pInit ->GetDataSize ();
			pauchInit = pInit ->GetData ();

			//
			// Simplify the constant on the parameter list
			// to check for unary minus values
			//

			NscSimplifyConstant (pauchInit, nInitSize);

			//
			// If not a simple value, then issue error
			//

			NscPCodeHeader *ph = (NscPCodeHeader *) pauchInit;
			if (ph ->nOpSize != nInitSize ||
				ph ->nOpCode != NscPCode_Constant)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorParamDefaultInitNotConstExp,
					pId ->GetIdentifier ());
			}

			//
			// If this is NWScript and we have object = int, then
			// adjust.
			//
			// NOTE: The NWScript prototype for SpeakOneLinerConversation
			//		uses a default value of OBJECT_TYPE_INVALID for and 
			//		object.  The problem is OBJECT_TYPE_INVALID is WRONG and
			//		really should be OBJECT_INVALID.
			//

			else if (g_pCtx ->IsNWScript () && 
				ph ->nType == NscType_Integer &&
				nType == NscType_Object)
			{
				pInit ->SetDataSize (0);
				pInit ->PushConstantObject (0x7F000000);
			}

			//
			// Validate that we have a matching type
			//

			else if (ph ->nType != nType)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (NscMessage_ErrorParamDeclTypeMismatch,
					pId ->GetIdentifier ());
			}
		}

		//
		// If we didn't generate an error
		//

		if (pOut ->GetType () != NscType_Error)
		{
			pOut ->SetType (nType);
			pOut ->PushDeclaration (pId ->GetIdentifier (),
				nType, pauchInit, nInitSize, -1, -1, 0);
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pType);
    g_pCtx ->FreePStackEntry (pId);
	if (pInit)
         g_pCtx ->FreePStackEntry (pInit);

	//
	// Return results
	//

	return pOut;
}